

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer_tests.cpp
# Opt level: O2

void check_insert_or_assign(json *example,string *path,json *value,json *expected)

{
  Flags resultDisposition;
  SourceLineInfo local_e8;
  AssertionHandler catchAssertionHandler;
  BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  local_90;
  StringRef local_60;
  StringRef local_50;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  jsoncons::jsonpointer::
  add<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
            (example,path,value,&ec);
  local_90.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65778c;
  local_90.super_ITransientExpression.m_isBinaryExpression = true;
  local_90.super_ITransientExpression.m_result = false;
  local_90.super_ITransientExpression._10_6_ = 0;
  local_e8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpointer/src/jsonpointer_tests.cpp"
  ;
  local_e8.line = 0x37;
  Catch::StringRef::StringRef(&local_50,"ec");
  resultDisposition = Catch::operator|(ContinueOnFailure,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_90,&local_e8,local_50,resultDisposition);
  local_90.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)&ec;
  Catch::AssertionHandler::handleExpr<std::error_code_const&>
            (&catchAssertionHandler,(ExprLhs<const_std::error_code_&> *)&local_90);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_90.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_90.super_ITransientExpression.m_isBinaryExpression = true;
  local_90.super_ITransientExpression.m_result = false;
  local_90.super_ITransientExpression._10_6_ = 0;
  local_e8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpointer/src/jsonpointer_tests.cpp"
  ;
  local_e8.line = 0x38;
  Catch::StringRef::StringRef(&local_60,"expected == example");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_90,&local_e8,local_60,ContinueOnFailure);
  local_e8.file = (char *)expected;
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==(&local_90,
             (ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
              *)&local_e8,example);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_90.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_90.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void check_insert_or_assign(json& example, const std::string& path, const json& value, const json& expected)
{
    std::error_code ec;
    jsonpointer::add(example, path, value, ec);
    CHECK_FALSE(ec);
    CHECK(expected == example);
}